

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void * arena_malloc_hard(tsdn_t *tsdn,arena_t *arena,size_t size,szind_t ind,_Bool zero)

{
  _Bool _Var1;
  undefined4 in_ECX;
  tsd_t *in_RDX;
  arena_t *in_RSI;
  arena_t *in_RDI;
  undefined1 in_R8B;
  arena_t *tsd_arena;
  size_t ret;
  uint8_t state;
  undefined3 in_stack_ffffffffffffff68;
  uint uVar2;
  void *local_78;
  arena_t *paVar3;
  arena_t *in_stack_ffffffffffffffa0;
  tsdn_t *in_stack_ffffffffffffffa8;
  
  uVar2 = CONCAT13(in_R8B,in_stack_ffffffffffffff68) & 0x1ffffff;
  paVar3 = in_RDI;
  if ((in_RDI != (arena_t *)0x0) && (in_stack_ffffffffffffffa0 = in_RDI, in_RSI == (arena_t *)0x0))
  {
    if ((in_RDX < oversize_threshold) ||
       ((in_stack_ffffffffffffffa8 = (tsdn_t *)(in_RDI->stats).mutex_prof_data[4].tot_wait_time.ns,
        in_stack_ffffffffffffffa8 != (tsdn_t *)0x0 &&
        (_Var1 = arena_is_auto((arena_t *)0x114c34), !_Var1)))) {
      in_RSI = arena_choose(in_RDX,(arena_t *)CONCAT44(in_ECX,uVar2));
    }
    else {
      in_RSI = arena_choose_huge((tsd_t *)CONCAT44(in_ECX,uVar2));
    }
  }
  if (in_RSI == (arena_t *)0x0) {
    local_78 = (void *)0x0;
  }
  else if (in_RDX < (tsd_t *)0x3801) {
    local_78 = arena_malloc_small(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                  (szind_t)((ulong)paVar3 >> 0x20),SUB81((ulong)paVar3 >> 0x18,0));
  }
  else {
    local_78 = large_malloc((tsdn_t *)in_RDI,in_RSI,(size_t)in_RDX,SUB41((uint)in_ECX >> 0x18,0));
  }
  return local_78;
}

Assistant:

void *
arena_malloc_hard(tsdn_t *tsdn, arena_t *arena, size_t size, szind_t ind,
    bool zero) {
	assert(!tsdn_null(tsdn) || arena != NULL);

	if (likely(!tsdn_null(tsdn))) {
		arena = arena_choose_maybe_huge(tsdn_tsd(tsdn), arena, size);
	}
	if (unlikely(arena == NULL)) {
		return NULL;
	}

	if (likely(size <= SC_SMALL_MAXCLASS)) {
		return arena_malloc_small(tsdn, arena, ind, zero);
	}
	return large_malloc(tsdn, arena, sz_index2size(ind), zero);
}